

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::ForceManager::preCalculation(ForceManager *this)

{
  Snapshot *this_00;
  ForceDecomposition *pFVar1;
  Molecule *pMVar2;
  Atom *this_01;
  RigidBody *this_02;
  CutoffGroup *this_03;
  SimInfo *this_04;
  pointer ppAVar3;
  pointer ppRVar4;
  pointer ppCVar5;
  MoleculeIterator mi;
  potVec zeroPot;
  SelectionSet local_178;
  MoleculeIterator local_160;
  double local_158;
  Vector<double,_3U> local_150;
  Vector<double,_7U> local_138;
  Vector<double,_7U> local_100;
  Vector<double,_7U> local_c8;
  Vector<double,_7U> local_90;
  Vector<double,_7U> local_58;
  
  local_160._M_node = (_Base_ptr)0x0;
  this_00 = this->info_->sman_->currentSnapshot_;
  (*this->fDecomp_->_vptr_ForceDecomposition[2])(this->fDecomp_,this_00);
  Snapshot::setBondPotential(this_00,0.0);
  Snapshot::setBendPotential(this_00,0.0);
  Snapshot::setTorsionPotential(this_00,0.0);
  Snapshot::setInversionPotential(this_00,0.0);
  local_178.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Vector<double,_7U>::Vector(&local_138,(double *)&local_178);
  Vector<double,_7U>::Vector(&local_58,&local_138);
  Snapshot::setLongRangePotentials(this_00,&local_58);
  Vector<double,_7U>::Vector(&local_90,&local_138);
  Snapshot::setExcludedPotentials(this_00,&local_90);
  if (this->doPotentialSelection_ == true) {
    Vector<double,_7U>::Vector(&local_c8,&local_138);
    Snapshot::setSelectionPotentials(this_00,&local_c8);
  }
  local_178.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Vector<double,_7U>::Vector(&local_100,(double *)&local_178);
  Snapshot::setSelfPotentials(this_00,&local_100);
  Snapshot::setRestraintPotential(this_00,0.0);
  Snapshot::setRawPotential(this_00,0.0);
  pMVar2 = SimInfo::beginMolecule(this->info_,&local_160);
  while (pMVar2 != (Molecule *)0x0) {
    ppAVar3 = (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar3 !=
        (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_001d8d03;
    this_01 = (Atom *)0x0;
    while (this_01 != (Atom *)0x0) {
      StuntDouble::zeroForcesAndTorques(&this_01->super_StuntDouble);
      ppAVar3 = ppAVar3 + 1;
      this_01 = (Atom *)0x0;
      if (ppAVar3 !=
          (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_001d8d03:
        this_01 = *ppAVar3;
      }
    }
    ppRVar4 = (pMVar2->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar4 !=
        (pMVar2->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001d8d37;
    this_02 = (RigidBody *)0x0;
    while (this_02 != (RigidBody *)0x0) {
      StuntDouble::zeroForcesAndTorques(&this_02->super_StuntDouble);
      ppRVar4 = ppRVar4 + 1;
      this_02 = (RigidBody *)0x0;
      if (ppRVar4 !=
          (pMVar2->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001d8d37:
        this_02 = *ppRVar4;
      }
    }
    this_04 = this->info_;
    if (this_04->nGlobalCutoffGroups_ != this_04->nGlobalAtoms_) {
      ppCVar5 = (pMVar2->cutoffGroups_).
                super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppCVar5 !=
          (pMVar2->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_001d8d77;
      this_03 = (CutoffGroup *)0x0;
      while (this_03 != (CutoffGroup *)0x0) {
        CutoffGroup::updateCOM(this_03);
        ppCVar5 = ppCVar5 + 1;
        this_03 = (CutoffGroup *)0x0;
        if (ppCVar5 !=
            (pMVar2->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_001d8d77:
          this_03 = *ppCVar5;
        }
      }
      this_04 = this->info_;
    }
    pMVar2 = SimInfo::nextMolecule(this_04,&local_160);
  }
  RectMatrix<double,_3U,_3U>::mul((RectMatrix<double,_3U,_3U> *)&this->virialTensor,0.0);
  pFVar1 = this->fDecomp_;
  local_158 = 0.0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_178,&local_158);
  Vector<double,_3U>::Vector(&local_150,(Vector<double,_3U> *)&local_178);
  (*pFVar1->_vptr_ForceDecomposition[0x2e])(pFVar1,&local_150);
  if ((this->doPotentialSelection_ == true) && ((this->evaluator_).isDynamic_ == true)) {
    SelectionEvaluator::evaluate(&local_178,&this->evaluator_);
    SelectionManager::setSelectionSet(&this->seleMan_,&local_178);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_178.bitsets_);
  }
  return;
}

Assistant:

void ForceManager::preCalculation() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    // forces and potentials are zeroed here, before any are
    // accumulated.

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    fDecomp_->setSnapshot(snap);

    snap->setBondPotential(0.0);
    snap->setBendPotential(0.0);
    snap->setTorsionPotential(0.0);
    snap->setInversionPotential(0.0);

    potVec zeroPot(0.0);
    snap->setLongRangePotentials(zeroPot);

    snap->setExcludedPotentials(zeroPot);
    if (doPotentialSelection_) snap->setSelectionPotentials(zeroPot);

    snap->setSelfPotentials(0.0);
    snap->setRestraintPotential(0.0);
    snap->setRawPotential(0.0);

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atom->zeroForcesAndTorques();
      }

      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->zeroForcesAndTorques();
      }

      if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          // calculate the center of mass of cutoff group
          cg->updateCOM();
        }
      }
    }

    // Zero out the virial tensor
    virialTensor *= 0.0;
    // Zero out the heatFlux
    fDecomp_->setHeatFlux(Vector3d(0.0));

    if (doPotentialSelection_) {
      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }
    }
  }